

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O0

String * __thiscall LexerScanner::readLine(String *__return_storage_ptr__,LexerScanner *this)

{
  char *pcVar1;
  bool bVar2;
  LexerScanner *this_local;
  String *line;
  
  String::String(__return_storage_ptr__);
  while( true ) {
    bVar2 = false;
    if (*this->m_position != '\n') {
      bVar2 = false;
      if (*this->m_position == '\r') {
        bVar2 = this->m_position[1] == '\n';
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (!bVar2) break;
    pcVar1 = this->m_position;
    this->m_position = pcVar1 + 1;
    String::operator+=(__return_storage_ptr__,*pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String LexerScanner::readLine()
{
	String line;

    while (*m_position != '\n' && !(*m_position == '\r' && *(m_position+1) == '\n'))
		line += *(m_position++);

	return line;
}